

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah_spatial.cpp
# Opt level: O2

void __thiscall
embree::sse2::
BVHNBuilderFastSpatialSAH<4,_embree::QuadMesh,_embree::QuadMv<4>,_embree::sse2::QuadSplitterFactory>
::build(BVHNBuilderFastSpatialSAH<4,_embree::QuadMesh,_embree::QuadMv<4>,_embree::sse2::QuadSplitterFactory>
        *this)

{
  size_t *psVar1;
  mvector<PrimRef> *prims;
  undefined8 *puVar2;
  undefined8 *puVar3;
  char cVar4;
  BVH *pBVar5;
  pointer ppTVar6;
  PrimRef *pPVar7;
  MemoryMonitorInterface *pMVar8;
  Geometry *pGVar9;
  BVHN<4> *this_00;
  double t0;
  double dVar10;
  undefined8 uVar11;
  bool bVar12;
  long lVar13;
  QuadMesh *pQVar14;
  Scene *pSVar15;
  ulong uVar16;
  PrimRef *pPVar17;
  size_t sVar18;
  NodeRef root;
  ulong uVar19;
  size_t i_1;
  size_t i;
  char *__rhs;
  EVP_PKEY_CTX *ctx;
  pointer ppTVar20;
  ulong uVar21;
  ulong uVar22;
  size_t sVar23;
  uint ret;
  uint uVar24;
  float fVar25;
  BuildProgressMonitor *in_stack_fffffffffffffe68;
  BuildProgressMonitor *in_stack_fffffffffffffe70;
  PrimInfo pinfo;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_88;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_68;
  size_t local_58;
  size_t sStack_50;
  undefined **local_40;
  Scene *local_38;
  
  pQVar14 = this->mesh;
  if (pQVar14 == (QuadMesh *)0x0) {
LAB_00498bc6:
    sVar18 = (this->scene->world).numQuads;
    this->numPreviousPrimitives = (uint)sVar18;
    if (sVar18 == 0) goto LAB_00498c29;
    pSVar15 = this->scene;
    uVar24 = 0;
    for (sVar23 = 0; (pSVar15->geometries).size_active != sVar23; sVar23 = sVar23 + 1) {
      pGVar9 = (pSVar15->geometries).items[sVar23].ptr;
      if ((((pGVar9 != (Geometry *)0x0) && (((uint)pGVar9->field_8 & 0x2000ff) == 0x200015)) &&
          (pGVar9->numTimeSteps == 1)) && (uVar24 <= (uint)sVar23)) {
        uVar24 = (uint)sVar23;
      }
    }
    bVar12 = true;
  }
  else {
    if ((pQVar14->super_Geometry).numPrimitives != this->numPreviousPrimitives) {
      pBVar5 = this->bvh;
      FastAllocator::internal_fix_used_blocks(&pBVar5->alloc);
      ppTVar6 = (pBVar5->alloc).thread_local_allocators.
                super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppTVar20 = (pBVar5->alloc).thread_local_allocators.
                      super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppTVar20 != ppTVar6;
          ppTVar20 = ppTVar20 + 1) {
        FastAllocator::ThreadLocal2::unbind(*ppTVar20,&pBVar5->alloc);
      }
      ppTVar20 = (pBVar5->alloc).thread_local_allocators.
                 super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((pBVar5->alloc).thread_local_allocators.
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppTVar20) {
        (pBVar5->alloc).thread_local_allocators.
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppTVar20;
      }
      LOCK();
      (pBVar5->alloc).bytesUsed.super___atomic_base<unsigned_long>._M_i = 0;
      UNLOCK();
      LOCK();
      (pBVar5->alloc).bytesFree.super___atomic_base<unsigned_long>._M_i = 0;
      UNLOCK();
      LOCK();
      (pBVar5->alloc).bytesWasted.super___atomic_base<unsigned_long>._M_i = 0;
      UNLOCK();
      if ((pBVar5->alloc).usedBlocks._M_b._M_p != (__pointer_type)0x0) {
        FastAllocator::Block::clear_list
                  ((pBVar5->alloc).usedBlocks._M_b._M_p,(pBVar5->alloc).device,
                   (pBVar5->alloc).useUSM);
      }
      LOCK();
      (pBVar5->alloc).usedBlocks._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      if ((pBVar5->alloc).freeBlocks._M_b._M_p != (__pointer_type)0x0) {
        FastAllocator::Block::clear_list
                  ((pBVar5->alloc).freeBlocks._M_b._M_p,(pBVar5->alloc).device,
                   (pBVar5->alloc).useUSM);
      }
      LOCK();
      (pBVar5->alloc).freeBlocks._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      for (lVar13 = -0x40; lVar13 != 0; lVar13 = lVar13 + 8) {
        LOCK();
        *(undefined8 *)((long)&(pBVar5->alloc).threadBlocks[0]._M_b._M_p + lVar13) = 0;
        UNLOCK();
        LOCK();
        *(undefined8 *)((long)&(pBVar5->alloc).threadBlocks[8]._M_b._M_p + lVar13) = 0;
        UNLOCK();
      }
      sVar18 = (pBVar5->alloc).primrefarray.size_alloced;
      pPVar7 = (pBVar5->alloc).primrefarray.items;
      if (pPVar7 != (PrimRef *)0x0) {
        if (sVar18 << 5 < 0x1c00000) {
          alignedFree(pPVar7);
        }
        else {
          os_free(pPVar7,sVar18 << 5,(pBVar5->alloc).primrefarray.alloc.hugepages);
        }
      }
      if (sVar18 != 0) {
        pMVar8 = (pBVar5->alloc).primrefarray.alloc.device;
        (**pMVar8->_vptr_MemoryMonitorInterface)(pMVar8,sVar18 * -0x20,1);
      }
      (pBVar5->alloc).primrefarray.items = (PrimRef *)0x0;
      (pBVar5->alloc).primrefarray.size_active = 0;
      (pBVar5->alloc).primrefarray.size_alloced = 0;
      pQVar14 = this->mesh;
      if (pQVar14 == (QuadMesh *)0x0) goto LAB_00498bc6;
    }
    uVar24 = (pQVar14->super_Geometry).numPrimitives;
    sVar18 = (size_t)uVar24;
    this->numPreviousPrimitives = uVar24;
    if (sVar18 == 0) {
LAB_00498c29:
      sVar18 = (this->prims0).size_alloced;
      pPVar7 = (this->prims0).items;
      if (pPVar7 != (PrimRef *)0x0) {
        if (sVar18 << 5 < 0x1c00000) {
          alignedFree(pPVar7);
        }
        else {
          os_free(pPVar7,sVar18 << 5,(this->prims0).alloc.hugepages);
        }
      }
      if (sVar18 != 0) {
        pMVar8 = (this->prims0).alloc.device;
        (**pMVar8->_vptr_MemoryMonitorInterface)(pMVar8,sVar18 * -0x20,1);
      }
      (this->prims0).items = (PrimRef *)0x0;
      (this->prims0).size_active = 0;
      (this->prims0).size_alloced = 0;
      (*(this->bvh->super_AccelData).super_RefCount._vptr_RefCount[5])();
      return;
    }
    uVar24 = this->geomID_;
    pSVar15 = this->scene;
    bVar12 = false;
  }
  cVar4 = *(char *)(*(long *)&(pSVar15->super_AccelN).field_0x188 + 0x464);
  this_00 = this->bvh;
  if (bVar12) {
    std::__cxx11::to_string(&local_b8,4);
    std::operator+(&local_d8,"sse2::BVH",&local_b8);
    __rhs = "BuilderFastSpatialSAH";
    if (0x7ffffff < uVar24 || cVar4 != '\0') {
      __rhs = "BuilderFastSpatialPresplitSAH";
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pinfo,
                   &local_d8,__rhs);
  }
  else {
    std::__cxx11::string::string((string *)&pinfo,"",(allocator *)&local_d8);
  }
  t0 = BVHN<4>::preBuild(this_00,(string *)&pinfo);
  std::__cxx11::string::~string((string *)&pinfo);
  if (bVar12) {
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  fVar25 = (float)sVar18 * this->splitFactor;
  uVar16 = (ulong)fVar25;
  uVar16 = (long)(fVar25 - 9.223372e+18) & (long)uVar16 >> 0x3f | uVar16;
  if (uVar16 < sVar18) {
    uVar16 = sVar18;
  }
  uVar19 = (this->prims0).size_alloced;
  uVar22 = uVar19;
  if ((uVar19 < uVar16) && (uVar21 = uVar19, uVar22 = uVar16, uVar19 != 0)) {
    for (; uVar22 = uVar21, uVar21 < uVar16; uVar21 = uVar21 * 2 + (ulong)(uVar21 * 2 == 0)) {
    }
  }
  psVar1 = &(this->prims0).size_active;
  if (uVar16 < (this->prims0).size_active) {
    *psVar1 = uVar16;
  }
  prims = &this->prims0;
  if (uVar19 == uVar22) {
    *psVar1 = uVar16;
    goto LAB_00498f00;
  }
  pPVar7 = (this->prims0).items;
  if (uVar22 == 0) {
    sVar23 = 0;
LAB_00498e67:
    pPVar17 = (PrimRef *)alignedMalloc(sVar23,0x20);
  }
  else {
    pMVar8 = (prims->alloc).device;
    sVar23 = uVar22 << 5;
    (**pMVar8->_vptr_MemoryMonitorInterface)(pMVar8,sVar23,0);
    if (sVar23 < 0x1c00000) goto LAB_00498e67;
    pPVar17 = (PrimRef *)os_malloc(sVar23,&(this->prims0).alloc.hugepages);
  }
  (this->prims0).items = pPVar17;
  lVar13 = 0x10;
  for (uVar19 = 0; uVar19 < *psVar1; uVar19 = uVar19 + 1) {
    pPVar17 = (this->prims0).items;
    puVar2 = (undefined8 *)((long)pPVar7 + lVar13 + -0x10);
    uVar11 = puVar2[1];
    puVar3 = (undefined8 *)((long)pPVar17 + lVar13 + -0x10);
    *puVar3 = *puVar2;
    puVar3[1] = uVar11;
    puVar2 = (undefined8 *)((long)&(pPVar7->lower).field_0 + lVar13);
    uVar11 = puVar2[1];
    puVar3 = (undefined8 *)((long)&(pPVar17->lower).field_0 + lVar13);
    *puVar3 = *puVar2;
    puVar3[1] = uVar11;
    lVar13 = lVar13 + 0x20;
  }
  sVar23 = (this->prims0).size_alloced;
  if (pPVar7 != (PrimRef *)0x0) {
    if (sVar23 << 5 < 0x1c00000) {
      alignedFree(pPVar7);
    }
    else {
      os_free(pPVar7,sVar23 << 5,(this->prims0).alloc.hugepages);
    }
  }
  if (sVar23 != 0) {
    pMVar8 = (prims->alloc).device;
    (**pMVar8->_vptr_MemoryMonitorInterface)(pMVar8,sVar23 * -0x20,1);
  }
  (this->prims0).size_active = uVar16;
  (this->prims0).size_alloced = uVar22;
LAB_00498f00:
  if (this->mesh != (QuadMesh *)0x0) {
    (this->bvh->alloc).atype = EMBREE_OS_MALLOC;
  }
  if (0x7ffffff < uVar24 || cVar4 != '\0') {
    if (this->mesh == (QuadMesh *)0x0) {
      createPrimRefArray_presplit<embree::QuadMesh,embree::sse2::QuadSplitterFactory>
                ((PrimInfo *)&local_98.field_1,(sse2 *)this->scene,(Scene *)0x200000,~MTY_ALL,
                 SUB81(sVar18,0),(size_t)prims,
                 (mvector<PrimRef> *)&this->bvh->scene->progressInterface,in_stack_fffffffffffffe70)
      ;
    }
    else {
      createPrimRefArray_presplit<embree::QuadMesh,embree::sse2::QuadSplitterFactory>
                ((PrimInfo *)&local_98.field_1,(sse2 *)this->mesh,(Geometry *)(ulong)uVar24,
                 (uint)sVar18,(size_t)prims,(mvector<PrimRef> *)&this->bvh->scene->progressInterface
                 ,in_stack_fffffffffffffe68);
    }
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_ =
         local_98._0_8_;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_ =
         local_98._8_8_;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_ =
         local_88._0_8_;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_ =
         local_88._8_8_;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
         local_78._0_8_;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
         local_78._8_8_;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
         local_68._0_8_;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
         local_68._8_8_;
    pinfo.begin = local_58;
    pinfo.end = sStack_50;
    dVar10 = (double)((sStack_50 - local_58) + 3 >> 2) * 1.2 * 224.0;
    uVar16 = (ulong)dVar10;
    sVar18 = ((long)(dVar10 - 9.223372036854776e+18) & (long)uVar16 >> 0x3f | uVar16) +
             (sStack_50 - local_58 & 0x1ffffffffffffff) * 8;
    FastAllocator::init_estimate(&this->bvh->alloc,sVar18);
    sVar18 = FastAllocator::fixSingleThreadThreshold
                       (&this->bvh->alloc,4,0x400,pinfo.end - pinfo.begin,sVar18);
    (this->settings).singleThreadThreshold = sVar18;
    (this->settings).branchingFactor = 4;
    (this->settings).maxDepth = 0x28;
    local_98._8_8_ = this->bvh;
    local_98._0_8_ = &PTR_createLeaf_021dd450;
    root.ptr = (size_t)BVHNBuilderVirtual<4>::BVHNBuilderV::build
                                 ((BVHNBuilderV *)&local_98.field_1,&((BVH *)local_98._8_8_)->alloc,
                                  &(((BVH *)local_98._8_8_)->scene->progressInterface).
                                   super_BuildProgressMonitor,(this->prims0).items,&pinfo,
                                  this->settings);
  }
  else {
    if (this->mesh == (QuadMesh *)0x0) {
      sse2::createPrimRefArray
                ((PrimInfo *)&local_98.field_1,this->scene,MTY_QUAD_MESH,false,uVar16,prims,
                 &(this->bvh->scene->progressInterface).super_BuildProgressMonitor);
    }
    else {
      sse2::createPrimRefArray
                ((PrimInfo *)&local_98.field_1,&this->mesh->super_Geometry,this->geomID_,uVar16,
                 prims,&(this->bvh->scene->progressInterface).super_BuildProgressMonitor);
    }
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_ =
         local_98._0_8_;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_ =
         local_98._8_8_;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_ =
         local_88._0_8_;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_ =
         local_88._8_8_;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
         local_78._0_8_;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
         local_78._8_8_;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
         local_68._0_8_;
    pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
         local_68._8_8_;
    pinfo.begin = local_58;
    pinfo.end = sStack_50;
    pSVar15 = this->scene;
    dVar10 = (double)((sStack_50 - local_58) + 3 >> 2) * 1.2 * 224.0;
    uVar19 = (ulong)dVar10;
    sVar18 = ((long)(dVar10 - 9.223372036854776e+18) & (long)uVar19 >> 0x3f | uVar19) +
             (sStack_50 - local_58 & 0x1ffffffffffffff) * 8;
    FastAllocator::init_estimate(&this->bvh->alloc,sVar18);
    sVar18 = FastAllocator::fixSingleThreadThreshold
                       (&this->bvh->alloc,4,0x400,pinfo.end - pinfo.begin,sVar18);
    (this->settings).singleThreadThreshold = sVar18;
    (this->settings).branchingFactor = 4;
    (this->settings).maxDepth = 0x28;
    local_98._0_8_ = this->bvh;
    local_40 = &PTR_operator___021d4948;
    local_38 = (((BVH *)local_98._0_8_)->scene->progressInterface).scene;
    root.ptr = (size_t)BVHBuilderBinnedFastSpatialSAH::
                       build<embree::NodeRefPtr<4>,embree::BVHN<4>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Create2,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Set2,embree::sse2::CreateLeafSpatial<4,embree::QuadMv<4>>,embree::sse2::QuadSplitterFactory,embree::Scene::BuildProgressMonitorInterface>
                                 (&((BVH *)local_98._0_8_)->alloc,&local_98,pSVar15,&local_40,
                                  (this->prims0).items,uVar16,&pinfo,&this->settings);
  }
  local_98._0_8_ =
       pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_;
  local_98._8_8_ =
       pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_;
  local_88._0_8_ =
       pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_;
  local_88._8_8_ =
       pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_;
  local_78._0_8_ =
       pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_;
  local_78._8_8_ =
       pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_;
  local_68._0_8_ =
       pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_;
  local_68._8_8_ =
       pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_;
  BVHN<4>::set(this->bvh,root,(LBBox3fa *)&local_98.field_1,pinfo.end - pinfo.begin);
  fVar25 = (float)(pinfo.end - pinfo.begin) * 0.005;
  uVar16 = (ulong)fVar25;
  ctx = (EVP_PKEY_CTX *)((long)(fVar25 - 9.223372e+18) & (long)uVar16 >> 0x3f | uVar16);
  BVHN<4>::layoutLargeNodes(this->bvh,(size_t)ctx);
  if ((this->scene != (Scene *)0x0) &&
     ((this->scene->scene_flags & RTC_SCENE_FLAG_DYNAMIC) == RTC_SCENE_FLAG_NONE)) {
    sVar18 = (this->prims0).size_alloced;
    pPVar7 = (this->prims0).items;
    if (pPVar7 != (PrimRef *)0x0) {
      ctx = (EVP_PKEY_CTX *)(sVar18 << 5);
      if (ctx < (EVP_PKEY_CTX *)0x1c00000) {
        alignedFree(pPVar7);
      }
      else {
        os_free(pPVar7,(size_t)ctx,(this->prims0).alloc.hugepages);
      }
    }
    if (sVar18 != 0) {
      pMVar8 = (prims->alloc).device;
      ctx = (EVP_PKEY_CTX *)(sVar18 * -0x20);
      (**pMVar8->_vptr_MemoryMonitorInterface)(pMVar8,ctx,1);
    }
    *psVar1 = 0;
    (this->prims0).size_alloced = 0;
    (this->prims0).items = (PrimRef *)0x0;
  }
  BVHN<4>::cleanup(this->bvh,ctx);
  BVHN<4>::postBuild(this->bvh,t0);
  return;
}

Assistant:

void build()
      {
        /* we reset the allocator when the mesh size changed */
        if (mesh && mesh->numPrimitives != numPreviousPrimitives) {
          bvh->alloc.clear();
        }

	/* skip build for empty scene */
        const size_t numOriginalPrimitives = mesh ? mesh->size() : scene->getNumPrimitives(Mesh::geom_type,false);
        numPreviousPrimitives = numOriginalPrimitives;
        if (numOriginalPrimitives == 0) {
          prims0.clear();
          bvh->clear();
          return;
        }

        const unsigned int maxGeomID = mesh ? geomID_ : scene->getMaxGeomID<Mesh,false>();
        const bool usePreSplits = scene->device->useSpatialPreSplits || (maxGeomID >= ((unsigned int)1 << (32-RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS)));
        double t0 = bvh->preBuild(mesh ? "" : TOSTRING(isa) "::BVH" + toString(N) + (usePreSplits ? "BuilderFastSpatialPresplitSAH" : "BuilderFastSpatialSAH"));

        /* create primref array */
        const size_t numSplitPrimitives = max(numOriginalPrimitives,size_t(splitFactor*numOriginalPrimitives));
        prims0.resize(numSplitPrimitives);

        /* enable os_malloc for two level build */
        if (mesh)
          bvh->alloc.setOSallocation(true);
	
	NodeRef root(0);
	PrimInfo pinfo;
	

        if (likely(usePreSplits))
	  {		     
            /* spatial presplit SAH BVH builder */
	    pinfo = mesh ?
	      createPrimRefArray_presplit<Mesh,Splitter>(mesh,maxGeomID,numOriginalPrimitives,prims0,bvh->scene->progressInterface) :
	      createPrimRefArray_presplit<Mesh,Splitter>(scene,Mesh::geom_type,false,numOriginalPrimitives,prims0,bvh->scene->progressInterface);

	    const size_t node_bytes = pinfo.size()*sizeof(typename BVH::AABBNode)/(4*N);
	    const size_t leaf_bytes = size_t(1.2*Primitive::blocks(pinfo.size())*sizeof(Primitive));
	    bvh->alloc.init_estimate(node_bytes+leaf_bytes);
	    settings.singleThreadThreshold = bvh->alloc.fixSingleThreadThreshold(N,DEFAULT_SINGLE_THREAD_THRESHOLD,pinfo.size(),node_bytes+leaf_bytes);

	    settings.branchingFactor = N;
	    settings.maxDepth = BVH::maxBuildDepthLeaf;

	    /* call BVH builder */
	    root = BVHNBuilderVirtual<N>::build(&bvh->alloc,CreateLeafSpatial<N,Primitive>(bvh),bvh->scene->progressInterface,prims0.data(),pinfo,settings);
	  }
	else
	  {
            /* standard spatial split SAH BVH builder */
	    pinfo = mesh ?
	      createPrimRefArray(mesh,geomID_,numSplitPrimitives,prims0,bvh->scene->progressInterface) :
	      createPrimRefArray(scene,Mesh::geom_type,false,numSplitPrimitives,prims0,bvh->scene->progressInterface);
	
	    Splitter splitter(scene);

	    const size_t node_bytes = pinfo.size()*sizeof(typename BVH::AABBNode)/(4*N);
	    const size_t leaf_bytes = size_t(1.2*Primitive::blocks(pinfo.size())*sizeof(Primitive));
	    bvh->alloc.init_estimate(node_bytes+leaf_bytes);
	    settings.singleThreadThreshold = bvh->alloc.fixSingleThreadThreshold(N,DEFAULT_SINGLE_THREAD_THRESHOLD,pinfo.size(),node_bytes+leaf_bytes);

	    settings.branchingFactor = N;
	    settings.maxDepth = BVH::maxBuildDepthLeaf;

	    /* call BVH builder */
	    root = BVHBuilderBinnedFastSpatialSAH::build<NodeRef>(
								  typename BVH::CreateAlloc(bvh),
								  typename BVH::AABBNode::Create2(),
								  typename BVH::AABBNode::Set2(),
								  CreateLeafSpatial<N,Primitive>(bvh),
								  splitter,
								  bvh->scene->progressInterface,
								  prims0.data(),
								  numSplitPrimitives,
								  pinfo,settings);

	    /* ==================== */
	  }

        bvh->set(root,LBBox3fa(pinfo.geomBounds),pinfo.size());
        bvh->layoutLargeNodes(size_t(pinfo.size()*0.005f));

	/* clear temporary data for static geometry */
	if (scene && scene->isStaticAccel()) {
          prims0.clear();
        }
	bvh->cleanup();
        bvh->postBuild(t0);
      }